

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpapiexsas.c
# Opt level: O3

HTTPAPIEX_SAS_HANDLE HTTPAPIEX_SAS_Create_From_String(char *key,char *uriResource,char *keyName)

{
  LOGGER_LOG p_Var1;
  HTTPAPIEX_SAS_STATE *pHVar2;
  
  if (key == (char *)0x0 || uriResource == (char *)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/src/httpapiexsas.c"
                ,"HTTPAPIEX_SAS_Create_From_String",0x45,1,
                "Invalid parameter key: %p, uriResource: %p",key,uriResource);
    }
    return (HTTPAPIEX_SAS_HANDLE)0x0;
  }
  pHVar2 = construct_httpex_sas(key,uriResource,keyName);
  return pHVar2;
}

Assistant:

HTTPAPIEX_SAS_HANDLE HTTPAPIEX_SAS_Create_From_String(const char* key, const char* uriResource, const char* keyName)
{
    HTTPAPIEX_SAS_HANDLE result = NULL;
    if (key == NULL || uriResource == NULL)
    {
        /* Codes_SRS_HTTPAPIEXSAS_07_001: [ If the parameter key or uriResource is NULL then HTTPAPIEX_SAS_Create_From_String shall return NULL. ] */
        LogError("Invalid parameter key: %p, uriResource: %p", key, uriResource);
        result = NULL;
    }
    else
    {
        /* Codes_SRS_HTTPAPIEXSAS_07_002: [ If there are any other errors in the instantiation of this handle then HTTPAPIEX_SAS_Create_From_String shall return NULL. ] */
        result = construct_httpex_sas(key, uriResource, keyName);
    }
    /* Codes_SRS_HTTPAPIEXSAS_07_003: [ HTTPAPIEX_SAS_Create_From_String shall create a new instance of HTTPAPIEX_SAS and return a non-NULL handle to it ] */
    return result;
}